

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::match_lt(Token *__return_storage_ptr__,Lexer *this)

{
  Position local_a8;
  TokenPosition local_98;
  Type local_7c;
  Position local_78;
  TokenPosition local_68;
  Type local_50;
  bool local_49;
  Position local_48;
  TokenPosition local_38;
  Type local_20;
  bool local_1a;
  bool local_19;
  Lexer *local_18;
  Lexer *this_local;
  
  local_19 = false;
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  consume(this,&local_19);
  if (this->current_ == '=') {
    local_1a = true;
    consume(this,&local_1a);
    local_20 = kLTE;
    Position::Position(&local_48,&(this->position_).super_Position);
    TokenPosition::TokenPosition(&local_38,&local_48,2);
    Token::Token(__return_storage_ptr__,&local_20,&local_38);
  }
  else if (this->current_ == '>') {
    local_49 = true;
    consume(this,&local_49);
    local_50 = kNotEqual;
    Position::Position(&local_78,&(this->position_).super_Position);
    TokenPosition::TokenPosition(&local_68,&local_78,2);
    Token::Token(__return_storage_ptr__,&local_50,&local_68);
  }
  else {
    local_7c = kLT;
    Position::Position(&local_a8,&(this->position_).super_Position);
    TokenPosition::TokenPosition(&local_98,&local_a8,1);
    Token::Token(__return_storage_ptr__,&local_7c,&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_lt() {
    consume(false);
    if (current_ == '=') {
        consume();
        return Token(Token::Type::kLTE, TokenPosition(position_, 2));
    } else if (current_ == '>') {
        consume();
        return Token(Token::Type::kNotEqual, TokenPosition(position_, 2));
    } else {
        return Token(Token::Type::kLT, TokenPosition(position_, 1));
    }
}